

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Maj3_ManAddCnf(Maj3_Man_t *p,int iMint)

{
  int iVar1;
  int *piVar2;
  bool local_62;
  bool local_61;
  uint local_60;
  uint local_5c;
  int nLits2;
  int nLits;
  int pLits [5];
  int *pVals;
  int local_28;
  int n;
  int j;
  int k;
  int i;
  int iMint_local;
  Maj3_Man_t *p_local;
  
  piVar2 = p->ObjVals;
  for (j = 0; j < p->nVars; j = j + 1) {
    piVar2[j] = iMint >> ((byte)j & 0x1f) & 1;
  }
  if (((*piVar2 == 0) || (local_61 = true, p->ObjVals[1] == 0)) &&
     ((*piVar2 == 0 || (local_61 = true, p->ObjVals[2] == 0)))) {
    local_62 = false;
    if (p->ObjVals[1] != 0) {
      local_62 = p->ObjVals[2] != 0;
    }
    local_61 = local_62;
  }
  piVar2[p->nVars] = (uint)local_61;
  iVar1 = Maj3_ManValue(iMint,p->nVars);
  piVar2[p->nObjs + -1] = iVar1;
  j = p->nVars;
  while (j = j + 1, j < p->nObjs + -1) {
    iVar1 = p->iVar;
    p->iVar = iVar1 + 1;
    piVar2[j] = iVar1;
  }
  bmcg_sat_solver_set_nvars(p->pSat,p->iVar);
  pVals._4_4_ = 0;
  do {
    if (1 < pVals._4_4_) {
      return 1;
    }
    j = p->nVars;
    while (j = j + 1, j < p->nObjs) {
      for (n = 0; n < p->nObjs; n = n + 1) {
        if ((0 < p->VarMarks[j][n]) && (piVar2[n] != (uint)((pVals._4_4_ != 0 ^ 0xffU) & 1))) {
          iVar1 = piVar2[n];
          if (1 < iVar1) {
            nLits2 = Abc_Var2Lit(piVar2[n],pVals._4_4_);
          }
          local_5c = (uint)(1 < iVar1);
          local_28 = n;
          if (1 < p->VarMarks[j][n]) {
            iVar1 = Abc_Var2Lit(p->VarMarks[j][n],1);
            (&nLits2)[(int)local_5c] = iVar1;
            local_5c = local_5c + 1;
          }
          while (local_28 = local_28 + 1, local_28 < p->nObjs) {
            if ((0 < p->VarMarks[j][local_28]) &&
               (local_60 = local_5c, piVar2[local_28] != (uint)((pVals._4_4_ != 0 ^ 0xffU) & 1))) {
              if (1 < piVar2[local_28]) {
                iVar1 = Abc_Var2Lit(piVar2[local_28],pVals._4_4_);
                local_60 = local_5c + 1;
                (&nLits2)[(int)local_5c] = iVar1;
              }
              if (1 < p->VarMarks[j][local_28]) {
                iVar1 = Abc_Var2Lit(p->VarMarks[j][local_28],1);
                (&nLits2)[(int)local_60] = iVar1;
                local_60 = local_60 + 1;
              }
              if (piVar2[j] != pVals._4_4_) {
                if (1 < piVar2[j]) {
                  iVar1 = Abc_Var2Lit(piVar2[j],(uint)((pVals._4_4_ != 0 ^ 0xffU) & 1));
                  (&nLits2)[(int)local_60] = iVar1;
                  local_60 = local_60 + 1;
                }
                if ((local_60 == 0) || (5 < local_60)) {
                  __assert_fail("nLits2 > 0 && nLits2 <= 5",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                                ,0x16f,"int Maj3_ManAddCnf(Maj3_Man_t *, int)");
                }
                iVar1 = bmcg_sat_solver_addclause(p->pSat,&nLits2,local_60);
                if (iVar1 == 0) {
                  return 0;
                }
              }
            }
          }
        }
      }
    }
    pVals._4_4_ = pVals._4_4_ + 1;
  } while( true );
}

Assistant:

int Maj3_ManAddCnf( Maj3_Man_t * p, int iMint )
{
    // input values
    int i, k, j, n, * pVals = p->ObjVals;
    for ( i = 0; i < p->nVars; i++ )
        pVals[i] = (iMint >> i) & 1;
    // first node value
    pVals[p->nVars] = (pVals[0] && pVals[1]) || (pVals[0] && pVals[2]) || (pVals[1] && pVals[2]);
    // last node value
    pVals[p->nObjs-1] = Maj3_ManValue(iMint, p->nVars);
    // intermediate node values
    for ( i = p->nVars + 1; i < p->nObjs - 1; i++ )
        pVals[i] = p->iVar++;
    //printf( "Adding clauses for minterm %d.\n", iMint );
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar );
    for ( n = 0; n < 2; n++ )
    for ( i = p->nVars + 1; i < p->nObjs; i++ )
    {
        //printf( "\nNode %d. Phase %d.\n", i, n );
        for ( k = 0; k < p->nObjs; k++ ) if ( p->VarMarks[i][k] >= 1 )
        {
            // add first input
            int pLits[5], nLits = 0;
            if ( pVals[k] == !n )
                continue;
            if ( pVals[k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( pVals[k], n );
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 1 );
            for ( j = k+1; j < p->nObjs; j++ ) if ( p->VarMarks[i][j] >= 1 )
            {
                // add second input
                int nLits2 = nLits;
                if ( pVals[j] == !n )
                    continue;
                if ( pVals[j] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( pVals[j], n );
                if ( p->VarMarks[i][j] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( p->VarMarks[i][j], 1 );
                // add output
                if ( pVals[i] == n )
                    continue;
                if ( pVals[i] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( pVals[i], !n );
                assert( nLits2 > 0 && nLits2 <= 5 );
                //Maj3_PrintClause( pLits, nLits2 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits2 ) )
                    return 0;
            }
        }
    }
    return 1;
}